

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_file_buffer.h
# Opt level: O1

int __thiscall cppcms::http::impl::file_buffer::underflow(file_buffer *this)

{
  pointer __ptr;
  int iVar1;
  size_t sVar2;
  byte *pbVar3;
  uint uVar4;
  long lVar5;
  
  if (this->in_memory_ == true) {
    lVar5 = *(long *)&this->field_0x8;
    pbVar3 = *(byte **)&this->field_0x28;
    *(long *)&this->field_0x8 = *(long *)&this->field_0x20;
    *(long *)&this->field_0x10 = (*(long *)&this->field_0x10 - lVar5) + *(long *)&this->field_0x20;
  }
  else {
    iVar1 = (**(code **)(*(long *)this + 0x30))(this);
    if (iVar1 < 0) {
      return -1;
    }
    lVar5 = (*(long *)&this->field_0x10 - *(long *)&this->field_0x8) + this->read_offset_;
    this->read_offset_ = lVar5;
    iVar1 = fseeko64((FILE *)this->f_,lVar5,0);
    if (iVar1 != 0) {
      return -1;
    }
    std::vector<char,_std::allocator<char>_>::resize(&this->input_,0x400);
    __ptr = (this->input_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start;
    sVar2 = fread(__ptr,1,0x400,(FILE *)this->f_);
    pbVar3 = (byte *)(__ptr + sVar2);
    *(pointer *)&this->field_0x8 = __ptr;
    *(pointer *)&this->field_0x10 = __ptr;
  }
  *(byte **)&this->field_0x18 = pbVar3;
  if (*(byte **)&this->field_0x10 == pbVar3) {
    uVar4 = 0xffffffff;
  }
  else {
    uVar4 = (uint)**(byte **)&this->field_0x10;
  }
  return uVar4;
}

Assistant:

int underflow()
	{
		if(in_memory_) {
			size_t read_size = gptr() - eback();
			setg(pbase(),pbase()+read_size,pptr());
		}
		else {
			if(sync() < 0)
				return -1;
			read_offset_ += gptr() - eback();
			if(fseeko(f_,read_offset_,SEEK_SET)!=0)
				return -1;
			input_.resize(buffer_size);
			char *input_data = &input_[0];
			size_t n = fread(input_data,1,buffer_size,f_);
			setg(input_data,input_data,input_data+n);
		}
		if(gptr()==egptr())
			return -1;
		return std::char_traits<char>::to_int_type(*gptr());
	}